

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# args.hxx
# Opt level: O2

void __thiscall
args::CompletionFlag::ParseValue
          (CompletionFlag *this,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *value_)

{
  const_reference pvVar1;
  istringstream local_190 [384];
  
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::at(value_,0);
  std::__cxx11::string::_M_assign((string *)&this->syntax);
  pvVar1 = std::
           vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ::at(value_,1);
  std::__cxx11::istringstream::istringstream(local_190,(string *)pvVar1,_S_in);
  std::istream::_M_extract<unsigned_long>((ulong *)local_190);
  std::__cxx11::istringstream::~istringstream(local_190);
  return;
}

Assistant:

virtual void ParseValue(const std::vector<std::string> &value_) override
            {
                syntax = value_.at(0);
                std::istringstream(value_.at(1)) >> cword;
            }